

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

boolean save_marker(j_decompress_ptr cinfo)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  jpeg_marker_reader *pjVar4;
  jpeg_source_mgr *pjVar5;
  jpeg_error_mgr *pjVar6;
  boolean bVar7;
  jpeg_marker_parser_method *pp_Var8;
  jpeg_saved_marker_ptr pjVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  jpeg_saved_marker_ptr pjVar14;
  byte *pbVar15;
  byte *pbVar16;
  uint datalen;
  ulong uVar17;
  bool bVar18;
  jpeg_saved_marker_ptr local_48;
  ulong local_38;
  
  pjVar4 = cinfo->marker;
  local_48 = (jpeg_saved_marker_ptr)pjVar4[6].read_markers;
  pjVar5 = cinfo->src;
  pbVar16 = pjVar5->next_input_byte;
  sVar13 = pjVar5->bytes_in_buffer;
  if (local_48 == (jpeg_saved_marker_ptr)0x0) {
    if (sVar13 == 0) {
      bVar7 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar7 == 0) {
        return 0;
      }
      pbVar16 = pjVar5->next_input_byte;
      sVar13 = pjVar5->bytes_in_buffer;
    }
    bVar2 = *pbVar16;
    sVar13 = sVar13 - 1;
    if (sVar13 == 0) {
      bVar7 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar7 == 0) {
        return 0;
      }
      pbVar15 = pjVar5->next_input_byte;
      sVar13 = pjVar5->bytes_in_buffer;
    }
    else {
      pbVar15 = pbVar16 + 1;
    }
    sVar13 = sVar13 - 1;
    pbVar16 = pbVar15 + 1;
    local_38 = ((ulong)bVar2 * 0x100 + (ulong)*pbVar15) - 2;
    uVar11 = 0;
    if (((ulong)bVar2 * 0x100 | (ulong)*pbVar15) < 2) {
      local_48 = (jpeg_saved_marker_ptr)0x0;
      uVar17 = 0;
      pjVar14 = (jpeg_saved_marker_ptr)0x0;
    }
    else {
      pp_Var8 = (jpeg_marker_parser_method *)
                ((long)pjVar4 + (long)cinfo->unread_marker * 4 + -0x2cc);
      if ((long)cinfo->unread_marker == 0xfe) {
        pp_Var8 = &pjVar4[4].read_restart_marker;
      }
      uVar17 = (ulong)*(uint *)pp_Var8;
      if ((uint)local_38 <= *(uint *)pp_Var8) {
        uVar17 = local_38 & 0xffffffff;
      }
      local_48 = (jpeg_saved_marker_ptr)
                 (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,uVar17 + 0x20);
      local_48->next = (jpeg_saved_marker_ptr)0x0;
      local_48->marker = (UINT8)*(code *)&cinfo->unread_marker;
      local_48->original_length = (uint)local_38;
      local_48->data_length = (uint)uVar17;
      pjVar14 = local_48 + 1;
      local_48->data = (JOCTET *)pjVar14;
      pjVar4[6].read_markers = (_func_int_j_decompress_ptr *)local_48;
      *(undefined4 *)&pjVar4[6].read_restart_marker = 0;
      uVar11 = 0;
    }
  }
  else {
    uVar17 = (ulong)local_48->data_length;
    pjVar14 = (jpeg_saved_marker_ptr)(local_48->data + *(uint *)&pjVar4[6].read_restart_marker);
    local_38 = 0;
    uVar11 = (ulong)*(uint *)&pjVar4[6].read_restart_marker;
  }
  do {
    do {
      uVar10 = (uint)uVar11;
      datalen = (uint)uVar17;
      if (datalen <= uVar10) {
        if (local_48 != (jpeg_saved_marker_ptr)0x0) {
          pjVar14 = cinfo->marker_list;
          if (cinfo->marker_list == (jpeg_saved_marker_ptr)0x0) {
            pjVar9 = (jpeg_saved_marker_ptr)&cinfo->marker_list;
          }
          else {
            do {
              pjVar9 = pjVar14;
              pjVar14 = pjVar9->next;
            } while (pjVar9->next != (jpeg_saved_marker_ptr)0x0);
          }
          pjVar9->next = local_48;
          pjVar14 = (jpeg_saved_marker_ptr)local_48->data;
          local_38 = (ulong)(local_48->original_length - datalen);
        }
        pjVar4[6].read_markers = (_func_int_j_decompress_ptr *)0x0;
        iVar3 = cinfo->unread_marker;
        if (iVar3 == 0xee) {
          examine_app14(cinfo,(JOCTET *)pjVar14,datalen,local_38);
        }
        else if (iVar3 == 0xe0) {
          examine_app0(cinfo,(JOCTET *)pjVar14,datalen,local_38);
        }
        else {
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 0x5d;
          (pjVar6->msg_parm).i[0] = iVar3;
          (cinfo->err->msg_parm).i[1] = datalen + (int)local_38;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
        }
        pjVar5->next_input_byte = pbVar16;
        pjVar5->bytes_in_buffer = sVar13;
        if (0 < (long)local_38) {
          (*cinfo->src->skip_input_data)(cinfo,local_38);
        }
        return 1;
      }
      pjVar5->next_input_byte = pbVar16;
      pjVar5->bytes_in_buffer = sVar13;
      *(uint *)&pjVar4[6].read_restart_marker = uVar10;
      if (sVar13 == 0) {
        bVar7 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar7 == 0) {
          return 0;
        }
        pbVar16 = pjVar5->next_input_byte;
        sVar13 = pjVar5->bytes_in_buffer;
      }
    } while ((datalen <= uVar10) || (sVar13 == 0));
    lVar12 = 0;
    do {
      *(byte *)((long)&pjVar14->next + lVar12) = pbVar16[lVar12];
      lVar1 = lVar12 + 1;
      if (datalen <= uVar10 + (int)lVar12 + 1) break;
      bVar18 = sVar13 - 1 != lVar12;
      lVar12 = lVar1;
    } while (bVar18);
    sVar13 = sVar13 - lVar1;
    pbVar16 = pbVar16 + lVar1;
    pjVar14 = (jpeg_saved_marker_ptr)((long)&pjVar14->next + lVar1);
    uVar11 = (ulong)(uVar10 + (int)lVar1);
  } while( true );
}

Assistant:

METHODDEF(boolean)
save_marker (j_decompress_ptr cinfo)
/* Save an APPn or COM marker into the marker list */
{
  my_marker_ptr marker = (my_marker_ptr) cinfo->marker;
  jpeg_saved_marker_ptr cur_marker = marker->cur_marker;
  unsigned int bytes_read, data_length;
  JOCTET FAR * data;
  INT32 length = 0;
  INPUT_VARS(cinfo);

  if (cur_marker == NULL) {
    /* begin reading a marker */
    INPUT_2BYTES(cinfo, length, return FALSE);
    length -= 2;
    if (length >= 0) {		/* watch out for bogus length word */
      /* figure out how much we want to save */
      unsigned int limit;
      if (cinfo->unread_marker == (int) M_COM)
	limit = marker->length_limit_COM;
      else
	limit = marker->length_limit_APPn[cinfo->unread_marker - (int) M_APP0];
      if ((unsigned int) length < limit)
	limit = (unsigned int) length;
      /* allocate and initialize the marker item */
      cur_marker = (jpeg_saved_marker_ptr)
	(*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				    SIZEOF(struct jpeg_marker_struct) + limit);
      cur_marker->next = NULL;
      cur_marker->marker = (UINT8) cinfo->unread_marker;
      cur_marker->original_length = (unsigned int) length;
      cur_marker->data_length = limit;
      /* data area is just beyond the jpeg_marker_struct */
      data = cur_marker->data = (JOCTET FAR *) (cur_marker + 1);
      marker->cur_marker = cur_marker;
      marker->bytes_read = 0;
      bytes_read = 0;
      data_length = limit;
    } else {
      /* deal with bogus length word */
      bytes_read = data_length = 0;
      data = NULL;
    }
  } else {
    /* resume reading a marker */
    bytes_read = marker->bytes_read;
    data_length = cur_marker->data_length;
    data = cur_marker->data + bytes_read;
  }

  while (bytes_read < data_length) {
    INPUT_SYNC(cinfo);		/* move the restart point to here */
    marker->bytes_read = bytes_read;
    /* If there's not at least one byte in buffer, suspend */
    MAKE_BYTE_AVAIL(cinfo, return FALSE);
    /* Copy bytes with reasonable rapidity */
    while (bytes_read < data_length && bytes_in_buffer > 0) {
      *data++ = *next_input_byte++;
      bytes_in_buffer--;
      bytes_read++;
    }
  }

  /* Done reading what we want to read */
  if (cur_marker != NULL) {	/* will be NULL if bogus length word */
    /* Add new marker to end of list */
    if (cinfo->marker_list == NULL) {
      cinfo->marker_list = cur_marker;
    } else {
      jpeg_saved_marker_ptr prev = cinfo->marker_list;
      while (prev->next != NULL)
	prev = prev->next;
      prev->next = cur_marker;
    }
    /* Reset pointer & calc remaining data length */
    data = cur_marker->data;
    length = cur_marker->original_length - data_length;
  }
  /* Reset to initial state for next marker */
  marker->cur_marker = NULL;

  /* Process the marker if interesting; else just make a generic trace msg */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, data, data_length, length);
    break;
  case M_APP14:
    examine_app14(cinfo, data, data_length, length);
    break;
  default:
    TRACEMS2(cinfo, 1, JTRC_MISC_MARKER, cinfo->unread_marker,
	     (int) (data_length + length));
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);		/* do before skip_input_data */
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long) length);

  return TRUE;
}